

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v6::internal::format_error_code
          (internal *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  size_t __n;
  uint32_t value;
  uint32_t n;
  writer w;
  
  buffer<char>::resize((buffer<char> *)this,0);
  value = (uint32_t)out;
  n = -value;
  if (0 < (int)value) {
    n = value;
  }
  uVar1 = count_digits(n);
  w.locale_.locale_ = (void *)0x0;
  __n = (((ulong)out & 0xffffffff) >> 0x1f) + (ulong)uVar1;
  w.out_.container = (buffer<char> *)this;
  if (message.data_ <= (char *)(0x1ec - __n)) {
    basic_writer<fmt::v6::buffer_range<char>_>::write(&w,error_code,message.data_,__n);
    basic_writer<fmt::v6::buffer_range<char>_>::write(&w,0x17db48,(void *)0x2,__n);
  }
  basic_writer<fmt::v6::buffer_range<char>_>::write(&w,0x17db29,(void *)0x6,__n);
  basic_writer<fmt::v6::buffer_range<char>_>::write_decimal<int>(&w,value);
  return;
}

Assistant:

FMT_FUNC void format_error_code(internal::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  internal::writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}